

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void key_iterator_suite::iterate_wstring(void)

{
  undefined1 *this;
  bool bVar1;
  type v;
  const_reference lhs;
  key_iterator local_148;
  int local_ec;
  key_iterator local_e8;
  undefined1 local_88 [8];
  key_iterator where;
  variable data;
  
  this = &where.index.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)this,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin
            ((key_iterator *)local_88,(basic_variable<std::allocator<char>_> *)this);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_e8,(basic_variable<std::allocator<char>_> *)&where.index.storage.field_0x28);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator!=
                    ((key_iterator *)local_88,&local_e8);
  boost::detail::test_impl
            ("where != data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc28,"void key_iterator_suite::iterate_wstring()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_e8);
  lhs = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator*
                  ((key_iterator *)local_88);
  local_ec = 0;
  v = trial::dynamic::operator==(lhs,&local_ec);
  boost::detail::test_impl
            ("*where == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc29,"void key_iterator_suite::iterate_wstring()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator++
            ((key_iterator *)local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_148,(basic_variable<std::allocator<char>_> *)&where.index.storage.field_0x28);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator==
                    ((key_iterator *)local_88,&local_148);
  boost::detail::test_impl
            ("where == data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc2b,"void key_iterator_suite::iterate_wstring()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_148);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator
            ((key_iterator *)local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&where.index.storage.field_0x28);
  return;
}

Assistant:

void iterate_wstring()
{
    variable data(L"bravo");
    auto where = data.key_begin();
    TRIAL_PROTOCOL_TEST(where != data.key_end());
    TRIAL_PROTOCOL_TEST(*where == 0);
    ++where;
    TRIAL_PROTOCOL_TEST(where == data.key_end());
}